

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O0

ConstPixelBufferAccess *
deqp::gls::FragmentOpUtil::getMultisampleAccess
          (ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *original)

{
  int height;
  int depth;
  int rowPitch;
  int slicePitch;
  TextureFormat *format;
  TextureFormat *this;
  void *data;
  ConstPixelBufferAccess *original_local;
  
  format = tcu::ConstPixelBufferAccess::getFormat(original);
  height = tcu::ConstPixelBufferAccess::getWidth(original);
  depth = tcu::ConstPixelBufferAccess::getHeight(original);
  this = tcu::ConstPixelBufferAccess::getFormat(original);
  rowPitch = tcu::TextureFormat::getPixelSize(this);
  slicePitch = tcu::ConstPixelBufferAccess::getRowPitch(original);
  data = tcu::ConstPixelBufferAccess::getDataPtr(original);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,format,1,height,depth,rowPitch,slicePitch,data);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess getMultisampleAccess(const tcu::ConstPixelBufferAccess& original)
{
	return tcu::ConstPixelBufferAccess(original.getFormat(),
									   1,
									   original.getWidth(),
									   original.getHeight(),
									   original.getFormat().getPixelSize(),
									   original.getRowPitch(),
									   original.getDataPtr());
}